

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandLine
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *fname,cmCustomCommandGenerator *ccg
          )

{
  pointer pbVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar6;
  pointer pbVar7;
  
  pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  for (pbVar7 = (pvVar3->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    poVar4 = std::operator<<(fout,(string *)fname);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(fout,"    :outputName=\"");
    poVar4 = std::operator<<(poVar4,(string *)pbVar7);
    poVar4 = std::operator<<(poVar4,"\"");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (bVar5) {
      pvVar3 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(ccg);
      pbVar2 = (pvVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (pvVar3->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2;
          pbVar6 = pbVar6 + 1) {
        poVar4 = std::operator<<(fout,"    :extraOutputFile=\"");
        poVar4 = std::operator<<(poVar4,(string *)pbVar6);
        poVar4 = std::operator<<(poVar4,"\"");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      pvVar3 = cmCustomCommandGenerator::GetDepends_abi_cxx11_(ccg);
      pbVar2 = (pvVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (pvVar3->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2;
          pbVar6 = pbVar6 + 1) {
        poVar4 = std::operator<<(fout,"    :depends=\"");
        poVar4 = std::operator<<(poVar4,(string *)pbVar6);
        poVar4 = std::operator<<(poVar4,"\"");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    bVar5 = false;
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandLine(
  std::ostream& fout, std::string& fname, cmCustomCommandGenerator const& ccg)
{
  /* NOTE: Customization Files are not well documented.  Testing showed
   * that ":outputName=file" can only be used once per script.  The
   * script will only run if ":outputName=file" is missing or just run
   * once if ":outputName=file" is not specified.  If there are
   * multiple outputs then the script needs to be listed multiple times
   * for each output.  Otherwise it won't rerun the script if one of
   * the outputs is manually deleted.
   */
  bool specifyExtra = true;
  for (auto& out : ccg.GetOutputs()) {
    fout << fname << std::endl;
    fout << "    :outputName=\"" << out << "\"" << std::endl;
    if (specifyExtra) {
      for (auto& byp : ccg.GetByproducts()) {
        fout << "    :extraOutputFile=\"" << byp << "\"" << std::endl;
      }
      for (auto& dep : ccg.GetDepends()) {
        fout << "    :depends=\"" << dep << "\"" << std::endl;
      }
      specifyExtra = false;
    }
  }
}